

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O1

void drop_near(chunk *c,object **dropped,wchar_t chance,loc grid,_Bool verbose,_Bool prefer_pile)

{
  object **ppoVar1;
  _Bool _Var2;
  wchar_t wVar3;
  uint32_t uVar4;
  uint32_t y;
  loc_conflict lVar5;
  loc lVar6;
  object *poVar7;
  square *psVar8;
  loc_conflict lVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  int x;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  _Bool dont_ignore;
  char o_name [80];
  _Bool local_e5;
  int local_e4;
  loc local_e0;
  loc_conflict local_d8;
  ulong local_d0;
  undefined4 local_c4;
  int local_c0;
  int local_bc;
  ulong local_b8;
  object **local_b0;
  chunk *local_a8;
  object *local_a0;
  player *local_98;
  loc local_90;
  char local_88 [88];
  
  local_c4 = CONCAT31(in_register_00000089,prefer_pile);
  if ((int)CONCAT71(in_register_00000081,verbose) == 0) {
    local_e5 = false;
  }
  else {
    _Var2 = ignore_item_ok(player,*dropped);
    local_e5 = !_Var2;
  }
  if ((chunk *)cave != c) {
    __assert_fail("c == cave",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/obj-pile.c"
                  ,0x46c,
                  "void drop_near(struct chunk *, struct object **, int, struct loc, _Bool, _Bool)")
    ;
  }
  object_desc(local_88,0x50,*dropped,0,player);
  if (((*dropped)->artifact == (artifact *)0x0) && (wVar3 = Rand_div(100), wVar3 < chance)) {
    poVar7 = *dropped;
    _Var2 = true;
  }
  else {
    local_d0 = (ulong)grid >> 0x20;
    local_98 = player;
    local_a0 = *dropped;
    iVar13 = -3;
    local_e4 = -1;
    local_d8 = (loc_conflict)((ulong)grid & 0xffffffff);
    local_e0 = grid;
    local_b8 = local_d0;
    local_b0 = dropped;
    local_a8 = c;
    do {
      local_c0 = iVar13 * iVar13;
      x = -3;
      local_bc = iVar13;
      do {
        uVar14 = x * x + local_c0;
        lVar5 = loc(x,local_bc);
        lVar6 = (loc)loc_sum((loc_conflict)grid,lVar5);
        if ((((uVar14 < 0xb) && (_Var2 = square_in_bounds_fully((chunk_conflict *)c,lVar6), _Var2))
            && (_Var2 = los((chunk_conflict *)c,(loc_conflict)grid,(loc_conflict)lVar6), _Var2)) &&
           ((_Var2 = square_isfloor((chunk_conflict *)c,lVar6), _Var2 &&
            (_Var2 = square_istrap((chunk_conflict *)c,lVar6), !_Var2)))) {
          poVar7 = square_object((chunk_conflict *)c,lVar6);
          if (poVar7 == (object *)0x0) {
            uVar12 = 1;
            iVar13 = 0;
          }
          else {
            iVar13 = 0;
            iVar11 = 0;
            bVar10 = 0;
            local_90 = lVar6;
            do {
              _Var2 = object_mergeable(poVar7,local_a0,OSTACK_FLOOR);
              if (_Var2) {
                bVar10 = 1;
              }
              _Var2 = ignore_item_ok(local_98,poVar7);
              iVar11 = iVar11 + (uint)!_Var2;
              iVar13 = iVar13 + (uint)_Var2;
              poVar7 = poVar7->next;
            } while (poVar7 != (object *)0x0);
            uVar12 = iVar11 + (uint)(~bVar10 & 1);
            lVar6 = local_90;
          }
          c = local_a8;
          if ((((local_98->opts).opt[0x23] != false) || (grid = local_e0, uVar12 < 2)) &&
             ((iVar13 + uVar12 <= (uint)z_info->floor_size ||
              (poVar7 = floor_get_oldest_ignored(local_98,local_a8,lVar6), grid = local_e0,
              poVar7 != (object *)0x0)))) {
            grid = local_e0;
            iVar13 = uVar12 * -5;
            if ((char)local_c4 != '\0') {
              iVar13 = 0;
            }
            iVar13 = (iVar13 - uVar14) + 1000;
            if ((local_e4 <= iVar13) && ((iVar13 != local_e4 || (uVar4 = Rand_div(2), uVar4 != 0))))
            {
              local_d0 = (ulong)lVar6 >> 0x20;
              local_d8 = (loc_conflict)((ulong)lVar6 & 0xffffffff);
              local_e4 = iVar13;
            }
          }
        }
        ppoVar1 = local_b0;
        x = x + 1;
      } while (x != 4);
      iVar13 = local_bc + 1;
    } while (iVar13 != 4);
    uVar15 = local_d0;
    if (local_e4 < 0) {
      if (local_a0->artifact == (artifact *)0x0) {
        uVar15 = local_b8 & 0xffffffff;
        wVar3 = grid.x;
      }
      else {
        uVar14 = 0;
        lVar5 = local_d8;
        do {
          if (uVar14 < 1000) {
            lVar9 = rand_loc((loc_conflict)((ulong)lVar5 & 0xffffffff | uVar15 << 0x20),1,1);
            lVar5 = (loc_conflict)((ulong)lVar9 & 0xffffffff);
            if (c->width <= lVar9.x) {
              lVar5.y = 0;
              lVar5.x = c->width + L'\xffffffff';
            }
            if (lVar5.x < 1) {
              lVar5.x = 0;
              lVar5.y = 0;
            }
            uVar15 = (ulong)lVar9 >> 0x20;
            if (c->height <= lVar9.y) {
              uVar15 = (ulong)(uint)(c->height + L'\xffffffff');
            }
            if ((int)uVar15 < 1) {
              uVar15 = 0;
            }
          }
          else {
            uVar4 = Rand_div(c->width);
            y = Rand_div(c->height);
            lVar5 = loc(uVar4,y);
            uVar15 = (ulong)lVar5 >> 0x20;
          }
          wVar3 = lVar5.x;
          _Var2 = square_canputitem((chunk_conflict *)c,
                                    (loc)((ulong)lVar5 & 0xffffffff | uVar15 << 0x20));
          if (_Var2) goto LAB_00193175;
          uVar14 = uVar14 + 1;
        } while (uVar14 != 2000);
        uVar15 = local_b8 & 0xffffffff;
        wVar3 = local_e0.x;
      }
    }
    else {
      wVar3 = local_d8.x;
    }
LAB_00193175:
    lVar6 = (loc)((ulong)(uint)wVar3 | uVar15 << 0x20);
    _Var2 = floor_carry(c,lVar6,*ppoVar1,&local_e5);
    if (_Var2) {
      sound(5);
      if (local_e5 != true) {
        return;
      }
      psVar8 = square((chunk_conflict *)c,lVar6);
      if (-1 < psVar8->mon) {
        return;
      }
      msg("You feel something roll beneath your feet.");
      return;
    }
    poVar7 = *ppoVar1;
    _Var2 = false;
  }
  floor_carry_fail(c,poVar7,_Var2);
  return;
}

Assistant:

void drop_near(struct chunk *c, struct object **dropped, int chance,
			   struct loc grid, bool verbose, bool prefer_pile)
{
	char o_name[80];
	struct loc best = grid;
	bool dont_ignore = verbose && !ignore_item_ok(player, *dropped);

	/* Only called in the current level */
	assert(c == cave);

	/* Describe object */
	object_desc(o_name, sizeof(o_name), *dropped, ODESC_BASE, player);

	/* Handle normal breakage */
	if (!((*dropped)->artifact) && (randint0(100) < chance)) {
		floor_carry_fail(c, *dropped, true);
		return;
	}

	/* Find the best grid and drop the item, destroying if there's no space */
	drop_find_grid(player, c, *dropped, prefer_pile, &best);
	if (floor_carry(c, best, *dropped, &dont_ignore)) {
		sound(MSG_DROP);
		if (dont_ignore && (square(c, best)->mon < 0)) {
			msg("You feel something roll beneath your feet.");
		}
	} else {
		floor_carry_fail(c, *dropped, false);
	}
}